

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigOper.c
# Opt level: O1

Aig_Obj_t * Aig_TableLookupInt(Aig_Man_t *p,Aig_Obj_t *p0,Aig_Obj_t *p1)

{
  ulong uVar1;
  Aig_Obj_t *pAVar2;
  ulong uVar3;
  Aig_Obj_t *pAVar4;
  
  pAVar2 = p0;
  if (p0 != p1) {
    pAVar4 = p->pConst1;
    pAVar2 = (Aig_Obj_t *)((ulong)pAVar4 ^ 1);
    if ((((pAVar2 != p1 && pAVar2 != p0) && ((Aig_Obj_t *)((ulong)p1 ^ 1) != p0)) &&
        (pAVar2 = p1, pAVar4 != p0)) && (pAVar2 = p0, pAVar4 != p1)) {
      uVar1 = (ulong)p0 & 0xfffffffffffffffe;
      uVar3 = (ulong)p1 & 0xfffffffffffffffe;
      pAVar2 = p1;
      pAVar4 = p0;
      if (*(int *)(uVar1 + 0x24) < *(int *)(uVar3 + 0x24)) {
        if ((*(uint *)(uVar1 + 0x18) & 7) == 1) {
LAB_006baad8:
          __assert_fail("Type != AIG_OBJ_AND || !Aig_ObjIsConst1(Aig_Regular(p0))",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aig.h"
                        ,0x15d,
                        "Aig_Obj_t *Aig_ObjCreateGhost(Aig_Man_t *, Aig_Obj_t *, Aig_Obj_t *, Aig_Type_t)"
                       );
        }
        if ((p1 != (Aig_Obj_t *)0x0) && ((*(uint *)(uVar3 + 0x18) & 7) == 1)) {
LAB_006bab16:
          __assert_fail("p1 == NULL || !Aig_ObjIsConst1(Aig_Regular(p1))",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aig.h"
                        ,0x15e,
                        "Aig_Obj_t *Aig_ObjCreateGhost(Aig_Man_t *, Aig_Obj_t *, Aig_Obj_t *, Aig_Type_t)"
                       );
        }
        if (uVar1 == uVar3) {
LAB_006baaf7:
          __assert_fail("Type == AIG_OBJ_CI || Aig_Regular(p0) != Aig_Regular(p1)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aig.h"
                        ,0x15f,
                        "Aig_Obj_t *Aig_ObjCreateGhost(Aig_Man_t *, Aig_Obj_t *, Aig_Obj_t *, Aig_Type_t)"
                       );
        }
        *(ulong *)&(p->Ghost).field_0x18 = *(ulong *)&(p->Ghost).field_0x18 & 0xfffffffffffffff8 | 5
        ;
        pAVar2 = p0;
        pAVar4 = p1;
        if ((p1 != (Aig_Obj_t *)0x0) &&
           (pAVar2 = p1, pAVar4 = p0, *(int *)(uVar1 + 0x24) < *(int *)(uVar3 + 0x24))) {
          pAVar2 = p0;
          pAVar4 = p1;
        }
      }
      else {
        if ((*(uint *)(uVar3 + 0x18) & 7) == 1) goto LAB_006baad8;
        if ((p0 != (Aig_Obj_t *)0x0) && ((*(uint *)(uVar1 + 0x18) & 7) == 1)) goto LAB_006bab16;
        if (uVar3 == uVar1) goto LAB_006baaf7;
        *(ulong *)&(p->Ghost).field_0x18 = *(ulong *)&(p->Ghost).field_0x18 & 0xfffffffffffffff8 | 5
        ;
        if ((p0 != (Aig_Obj_t *)0x0) && (*(int *)(uVar1 + 0x24) <= *(int *)(uVar3 + 0x24))) {
          pAVar2 = p0;
          pAVar4 = p1;
        }
      }
      (p->Ghost).pFanin0 = pAVar2;
      (p->Ghost).pFanin1 = pAVar4;
      pAVar2 = Aig_TableLookup(p,&p->Ghost);
      return pAVar2;
    }
  }
  return pAVar2;
}

Assistant:

Aig_Obj_t * Aig_TableLookupInt( Aig_Man_t * p, Aig_Obj_t * p0, Aig_Obj_t * p1 )
{
    if ( p0 == p1 )
        return p0;
    if ( p0 == Aig_ManConst0(p) || p1 == Aig_ManConst0(p) || p0 == Aig_Not(p1) )
        return Aig_ManConst0(p);
    if ( p0 == Aig_ManConst1(p) )
        return p1;
    if ( p1 == Aig_ManConst1(p) )
        return p0;
    if ( Aig_Regular(p0)->Id < Aig_Regular(p1)->Id )
        return Aig_TableLookup( p, Aig_ObjCreateGhost(p, p0, p1, AIG_OBJ_AND) );
    return Aig_TableLookup( p, Aig_ObjCreateGhost(p, p1, p0, AIG_OBJ_AND) );
}